

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O0

long jsteemann::atoi_positive<long>(char *p,char *e,bool *valid)

{
  char cVar1;
  bool local_44;
  bool local_42;
  char *pcStack_40;
  char c;
  long result;
  char cutlim;
  long cutoff;
  bool *valid_local;
  char *e_local;
  char *p_local;
  
  if (p == e) {
    *valid = false;
    p_local = (char *)0x0;
  }
  else {
    pcStack_40 = (char *)0x0;
    e_local = p;
    do {
      cVar1 = *e_local;
      local_42 = cVar1 < '0' || '9' < cVar1;
      if (local_42) {
        *valid = false;
        return (long)pcStack_40;
      }
      local_44 = true;
      if ((long)pcStack_40 < 0xccccccccccccccd) {
        local_44 = pcStack_40 == (char *)0xccccccccccccccc && '\a' < (char)(cVar1 + -0x30);
      }
      if (local_44) {
        *valid = false;
        return (long)pcStack_40;
      }
      pcStack_40 = (char *)((long)(char)(cVar1 + -0x30) + (long)pcStack_40 * 10);
      e_local = e_local + 1;
    } while (e_local < e);
    *valid = true;
    p_local = pcStack_40;
  }
  return (long)p_local;
}

Assistant:

inline T atoi_positive(char const* p, char const* e, bool& valid) noexcept {
  if (ATOI_UNLIKELY(p == e)) {
    valid = false;
    return T();
  }

  constexpr T cutoff = (std::numeric_limits<T>::max)() / 10;
  constexpr char cutlim = (std::numeric_limits<T>::max)() % 10;
  T result = 0;

  do {
    char c = *p;

    // we expect only '0' to '9'. everything else is unexpected
    if (ATOI_UNLIKELY(c < '0' || c > '9')) {
      valid = false;
      return result;
    }

    c -= '0';
    // we expect the bulk of values to not hit the bounds restrictions
    if (ATOI_UNLIKELY(result > cutoff || (result == cutoff && c > cutlim))) {
      valid = false;
      return result;
    } 
    result *= 10;
    result += c;
  } while (++p < e);

  valid = true;
  return result;
}